

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::glog_internal_namespace_::ShutdownGoogleLoggingUtilities(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_70;
  LogMessageVoidify local_9;
  
  bVar1 = IsGoogleLoggingInitialized();
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    g_program_invocation_short_name = 0;
    closelog();
    return;
  }
  LogMessageVoidify::LogMessageVoidify(&local_9);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/utilities.cc"
             ,0x138);
  poVar2 = LogMessage::stream(&local_70);
  poVar2 = std::operator<<(poVar2,"Check failed: IsGoogleLoggingInitialized() ");
  poVar2 = std::operator<<(poVar2,
                           "You called ShutdownGoogleLogging() without calling InitGoogleLogging() first!"
                          );
  LogMessageVoidify::operator&(&local_9,poVar2);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_70);
}

Assistant:

void ShutdownGoogleLoggingUtilities() {
  CHECK(IsGoogleLoggingInitialized())
      << "You called ShutdownGoogleLogging() without calling "
         "InitGoogleLogging() first!";
  g_program_invocation_short_name = nullptr;
#ifdef HAVE_SYSLOG_H
  closelog();
#endif
}